

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

CURLcode dohprobe(Curl_easy *data,dnsprobe *p,DNStype dnstype,char *host,char *url,CURLM *multi,
                 curl_slist *headers)

{
  long lVar1;
  undefined8 uVar2;
  CURLMcode CVar3;
  dohresponse *pdVar4;
  dohresponse *resp;
  size_t b64len;
  char *b64;
  timediff_t tStack_60;
  DOHcode d;
  timediff_t timeout_ms;
  CURLM *pCStack_50;
  CURLcode result;
  char *nurl;
  Curl_easy *doh;
  CURLM *multi_local;
  char *url_local;
  char *host_local;
  dnsprobe *pdStack_20;
  DNStype dnstype_local;
  dnsprobe *p_local;
  Curl_easy *data_local;
  
  nurl = (char *)0x0;
  pCStack_50 = (CURLM *)0x0;
  timeout_ms._4_4_ = CURLE_OK;
  doh = (Curl_easy *)multi;
  multi_local = (CURLM *)url;
  url_local = host;
  host_local._4_4_ = dnstype;
  pdStack_20 = p;
  p_local = (dnsprobe *)data;
  b64._4_4_ = doh_encode(host,dnstype,p->dohbuffer,0x200,&p->dohlen);
  if (b64._4_4_ != DOH_OK) {
    Curl_failf((Curl_easy *)p_local,"Failed to encode DOH packet [%d]\n",(ulong)b64._4_4_);
    return CURLE_OUT_OF_MEMORY;
  }
  pdStack_20->dnstype = host_local._4_4_;
  (pdStack_20->serverdoh).memory = (uchar *)0x0;
  (pdStack_20->serverdoh).size = 0;
  if ((*(ulong *)(p_local[6].dohbuffer + 0x1e4) & 0x100000000000000) != 0) {
    timeout_ms._4_4_ =
         Curl_base64url_encode
                   ((Curl_easy *)p_local,(char *)pdStack_20->dohbuffer,pdStack_20->dohlen,
                    (char **)&b64len,(size_t *)&resp);
    if (timeout_ms._4_4_ != CURLE_OK) goto LAB_0014f3a5;
    pCStack_50 = (CURLM *)curl_maprintf("%s?dns=%s",multi_local,b64len);
    (*Curl_cfree)((void *)b64len);
    if (pCStack_50 == (CURLM *)0x0) {
      timeout_ms._4_4_ = CURLE_OUT_OF_MEMORY;
      goto LAB_0014f3a5;
    }
    multi_local = pCStack_50;
  }
  tStack_60 = Curl_timeleft((Curl_easy *)p_local,(curltime *)0x0,true);
  timeout_ms._4_4_ = Curl_open((Curl_easy **)&nurl);
  if (timeout_ms._4_4_ == CURLE_OK) {
    pdVar4 = &pdStack_20->serverdoh;
    timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_URL,multi_local);
    if ((((timeout_ms._4_4_ == CURLE_OK) &&
         (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_WRITEFUNCTION,doh_write_cb),
         timeout_ms._4_4_ == CURLE_OK)) &&
        (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_WRITEDATA,pdVar4),
        timeout_ms._4_4_ == CURLE_OK)) &&
       (((*(ulong *)(p_local[6].dohbuffer + 0x1e4) >> 0x38 & 1) != 0 ||
        ((timeout_ms._4_4_ =
               curl_easy_setopt((Curl_easy *)nurl,CURLOPT_POSTFIELDS,pdStack_20->dohbuffer),
         timeout_ms._4_4_ == CURLE_OK &&
         (timeout_ms._4_4_ =
               curl_easy_setopt((Curl_easy *)nurl,CURLOPT_POSTFIELDSIZE,pdStack_20->dohlen),
         timeout_ms._4_4_ == CURLE_OK)))))) {
      timeout_ms._4_4_ = 0;
      timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_HTTPHEADER,headers);
      if (((((timeout_ms._4_4_ == CURLE_OK) &&
            ((((timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_PROTOCOLS,2),
               timeout_ms._4_4_ == CURLE_OK &&
               (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_TIMEOUT_MS,tStack_60),
               timeout_ms._4_4_ == CURLE_OK)) &&
              (((*(ulong *)(p_local[6].dohbuffer + 0x1e4) >> 0x1e & 1) == 0 ||
               (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_VERBOSE,1),
               timeout_ms._4_4_ == CURLE_OK)))) &&
             (((*(ulong *)(p_local[6].dohbuffer + 0x1e4) >> 0x22 & 1) == 0 ||
              (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_NOSIGNAL,1),
              timeout_ms._4_4_ == CURLE_OK)))))) &&
           (((p_local[5].dohbuffer[0x14] >> 1 & 1) == 0 ||
            (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_FALSESTART,1),
            timeout_ms._4_4_ == CURLE_OK)))) &&
          (((((p_local[4].dohbuffer[0x1e4] >> 1 & 1) == 0 ||
             (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_VERIFYHOST,2),
             timeout_ms._4_4_ == CURLE_OK)) &&
            (((p_local[5].dohbuffer[100] >> 1 & 1) == 0 ||
             (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_PROXY_SSL_VERIFYHOST,2),
             timeout_ms._4_4_ == CURLE_OK)))) &&
           (((((p_local[4].dohbuffer[0x1e4] & 1) == 0 ||
              (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_VERIFYPEER,1),
              timeout_ms._4_4_ == CURLE_OK)) &&
             (((p_local[5].dohbuffer[100] & 1) == 0 ||
              (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_PROXY_SSL_VERIFYPEER,1)
              , timeout_ms._4_4_ == CURLE_OK)))) &&
            (((((p_local[4].dohbuffer[0x1e4] >> 2 & 1) == 0 ||
               (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_VERIFYSTATUS,1),
               timeout_ms._4_4_ == CURLE_OK)) &&
              ((*(long *)(p_local[6].dohbuffer + 4) == 0 ||
               (timeout_ms._4_4_ =
                     curl_easy_setopt((Curl_easy *)nurl,CURLOPT_CAINFO,
                                      *(undefined8 *)(p_local[6].dohbuffer + 4)),
               timeout_ms._4_4_ == CURLE_OK)))) &&
             ((*(long *)(p_local[6].dohbuffer + 0xc) == 0 ||
              (timeout_ms._4_4_ =
                    curl_easy_setopt((Curl_easy *)nurl,CURLOPT_PROXY_CAINFO,
                                     *(undefined8 *)(p_local[6].dohbuffer + 0xc)),
              timeout_ms._4_4_ == CURLE_OK)))))))))) &&
         (((p_local[6].easy == (CURL_conflict *)0x0 ||
           (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_CAPATH,p_local[6].easy),
           timeout_ms._4_4_ == CURLE_OK)) &&
          ((((((((lVar1._0_4_ = p_local[6].dnstype, lVar1._4_1_ = p_local[6].dohbuffer[0],
                 lVar1._5_1_ = p_local[6].dohbuffer[1], lVar1._6_1_ = p_local[6].dohbuffer[2],
                 lVar1._7_1_ = p_local[6].dohbuffer[3], lVar1 == 0 ||
                 (uVar2._0_4_ = p_local[6].dnstype, uVar2._4_1_ = p_local[6].dohbuffer[0],
                 uVar2._5_1_ = p_local[6].dohbuffer[1], uVar2._6_1_ = p_local[6].dohbuffer[2],
                 uVar2._7_1_ = p_local[6].dohbuffer[3],
                 timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_PROXY_CAPATH,uVar2),
                 timeout_ms._4_4_ == CURLE_OK)) &&
                ((*(long *)(p_local[6].dohbuffer + 0x5c) == 0 ||
                 (timeout_ms._4_4_ =
                       curl_easy_setopt((Curl_easy *)nurl,CURLOPT_CRLFILE,
                                        *(undefined8 *)(p_local[6].dohbuffer + 0x5c)),
                 timeout_ms._4_4_ == CURLE_OK)))) &&
               ((*(long *)(p_local[6].dohbuffer + 100) == 0 ||
                (timeout_ms._4_4_ =
                      curl_easy_setopt((Curl_easy *)nurl,CURLOPT_PROXY_CRLFILE,
                                       *(undefined8 *)(p_local[6].dohbuffer + 100)),
                timeout_ms._4_4_ == CURLE_OK)))) &&
              (((p_local[5].dohbuffer[0x14] & 1) == 0 ||
               (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_CERTINFO,1),
               timeout_ms._4_4_ == CURLE_OK)))) &&
             (((*(long *)(p_local[6].dohbuffer + 0x4c) == 0 ||
               (timeout_ms._4_4_ =
                     curl_easy_setopt((Curl_easy *)nurl,CURLOPT_RANDOM_FILE,
                                      *(undefined8 *)(p_local[6].dohbuffer + 0x4c)),
               timeout_ms._4_4_ == CURLE_OK)) &&
              ((*(long *)(p_local[6].dohbuffer + 0x44) == 0 ||
               (timeout_ms._4_4_ =
                     curl_easy_setopt((Curl_easy *)nurl,CURLOPT_EGDSOCKET,
                                      *(undefined8 *)(p_local[6].dohbuffer + 0x44)),
               timeout_ms._4_4_ == CURLE_OK)))))) &&
            ((((p_local[5].dohbuffer[0x14] >> 3 & 1) == 0 ||
              (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_OPTIONS,2),
              timeout_ms._4_4_ == CURLE_OK)) &&
             (((p_local[5].dohbuffer[0xbc] >> 3 & 1) == 0 ||
              (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_PROXY_SSL_OPTIONS,2),
              timeout_ms._4_4_ == CURLE_OK)))))) &&
           (((p_local[4].dohlen == 0 ||
             (timeout_ms._4_4_ =
                   curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_CTX_FUNCTION,p_local[4].dohlen),
             timeout_ms._4_4_ == CURLE_OK)) &&
            ((p_local[4].serverdoh.memory == (uchar *)0x0 ||
             (timeout_ms._4_4_ =
                   curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_CTX_DATA,
                                    p_local[4].serverdoh.memory), timeout_ms._4_4_ == CURLE_OK))))))
          )))) {
        *(code **)(nurl + 0xeb8) = Curl_doh_done;
        *(dnsprobe **)(nurl + 0xec0) = p_local;
        pdStack_20->easy = (CURL_conflict *)nurl;
        CVar3 = curl_multi_add_handle((Curl_multi *)doh,(Curl_easy *)nurl);
        if (CVar3 == CURLM_OK) {
          (*Curl_cfree)(pCStack_50);
          return CURLE_OK;
        }
      }
    }
  }
LAB_0014f3a5:
  (*Curl_cfree)(pCStack_50);
  Curl_close((Curl_easy *)nurl);
  return timeout_ms._4_4_;
}

Assistant:

static CURLcode dohprobe(struct Curl_easy *data,
                         struct dnsprobe *p, DNStype dnstype,
                         const char *host,
                         const char *url, CURLM *multi,
                         struct curl_slist *headers)
{
  struct Curl_easy *doh = NULL;
  char *nurl = NULL;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  DOHcode d = doh_encode(host, dnstype, p->dohbuffer, sizeof(p->dohbuffer),
                         &p->dohlen);
  if(d) {
    failf(data, "Failed to encode DOH packet [%d]\n", d);
    return CURLE_OUT_OF_MEMORY;
  }

  p->dnstype = dnstype;
  p->serverdoh.memory = NULL;
  /* the memory will be grown as needed by realloc in the doh_write_cb
     function */
  p->serverdoh.size = 0;

  /* Note: this is code for sending the DoH request with GET but there's still
     no logic that actually enables this. We should either add that ability or
     yank out the GET code. Discuss! */
  if(data->set.doh_get) {
    char *b64;
    size_t b64len;
    result = Curl_base64url_encode(data, (char *)p->dohbuffer, p->dohlen,
                                   &b64, &b64len);
    if(result)
      goto error;
    nurl = aprintf("%s?dns=%s", url, b64);
    free(b64);
    if(!nurl) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }
    url = nurl;
  }

  timeout_ms = Curl_timeleft(data, NULL, TRUE);

  /* Curl_open() is the internal version of curl_easy_init() */
  result = Curl_open(&doh);
  if(!result) {
    /* pass in the struct pointer via a local variable to please coverity and
       the gcc typecheck helpers */
    struct dohresponse *resp = &p->serverdoh;
    ERROR_CHECK_SETOPT(CURLOPT_URL, url);
    ERROR_CHECK_SETOPT(CURLOPT_WRITEFUNCTION, doh_write_cb);
    ERROR_CHECK_SETOPT(CURLOPT_WRITEDATA, resp);
    if(!data->set.doh_get) {
      ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDS, p->dohbuffer);
      ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDSIZE, (long)p->dohlen);
    }
    ERROR_CHECK_SETOPT(CURLOPT_HTTPHEADER, headers);
#ifdef USE_NGHTTP2
    ERROR_CHECK_SETOPT(CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_2TLS);
#endif
#ifndef CURLDEBUG
    /* enforce HTTPS if not debug */
    ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTPS);
#endif
    ERROR_CHECK_SETOPT(CURLOPT_TIMEOUT_MS, (long)timeout_ms);
    if(data->set.verbose)
      ERROR_CHECK_SETOPT(CURLOPT_VERBOSE, 1L);
    if(data->set.no_signal)
      ERROR_CHECK_SETOPT(CURLOPT_NOSIGNAL, 1L);

    /* Inherit *some* SSL options from the user's transfer. This is a
       best-guess as to which options are needed for compatibility. #3661 */
    if(data->set.ssl.falsestart)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_FALSESTART, 1L);
    if(data->set.ssl.primary.verifyhost)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYHOST, 2L);
    if(data->set.proxy_ssl.primary.verifyhost)
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_SSL_VERIFYHOST, 2L);
    if(data->set.ssl.primary.verifypeer)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYPEER, 1L);
    if(data->set.proxy_ssl.primary.verifypeer)
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_SSL_VERIFYPEER, 1L);
    if(data->set.ssl.primary.verifystatus)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYSTATUS, 1L);
    if(data->set.str[STRING_SSL_CAFILE_ORIG]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAINFO,
        data->set.str[STRING_SSL_CAFILE_ORIG]);
    }
    if(data->set.str[STRING_SSL_CAFILE_PROXY]) {
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_CAINFO,
        data->set.str[STRING_SSL_CAFILE_PROXY]);
    }
    if(data->set.str[STRING_SSL_CAPATH_ORIG]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAPATH,
        data->set.str[STRING_SSL_CAPATH_ORIG]);
    }
    if(data->set.str[STRING_SSL_CAPATH_PROXY]) {
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_CAPATH,
        data->set.str[STRING_SSL_CAPATH_PROXY]);
    }
    if(data->set.str[STRING_SSL_CRLFILE_ORIG]) {
      ERROR_CHECK_SETOPT(CURLOPT_CRLFILE,
        data->set.str[STRING_SSL_CRLFILE_ORIG]);
    }
    if(data->set.str[STRING_SSL_CRLFILE_PROXY]) {
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_CRLFILE,
        data->set.str[STRING_SSL_CRLFILE_PROXY]);
    }
    if(data->set.ssl.certinfo)
      ERROR_CHECK_SETOPT(CURLOPT_CERTINFO, 1L);
    if(data->set.str[STRING_SSL_RANDOM_FILE]) {
      ERROR_CHECK_SETOPT(CURLOPT_RANDOM_FILE,
        data->set.str[STRING_SSL_RANDOM_FILE]);
    }
    if(data->set.str[STRING_SSL_EGDSOCKET]) {
      ERROR_CHECK_SETOPT(CURLOPT_EGDSOCKET,
        data->set.str[STRING_SSL_EGDSOCKET]);
    }
    if(data->set.ssl.no_revoke)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_OPTIONS, CURLSSLOPT_NO_REVOKE);
    if(data->set.proxy_ssl.no_revoke)
      ERROR_CHECK_SETOPT(CURLOPT_PROXY_SSL_OPTIONS, CURLSSLOPT_NO_REVOKE);
    if(data->set.ssl.fsslctx)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_FUNCTION, data->set.ssl.fsslctx);
    if(data->set.ssl.fsslctxp)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_DATA, data->set.ssl.fsslctxp);

    doh->set.fmultidone = Curl_doh_done;
    doh->set.dohfor = data; /* identify for which transfer this is done */
    p->easy = doh;

    /* add this transfer to the multi handle */
    if(curl_multi_add_handle(multi, doh))
      goto error;
  }
  else
    goto error;
  free(nurl);
  return CURLE_OK;

  error:
  free(nurl);
  Curl_close(doh);
  return result;
}